

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationTests.cpp
# Opt level: O3

void vkt::tessellation::anon_unknown_1::createChildren(TestCaseGroup *tessellationTests)

{
  TestContext *testCtx;
  TestNode *pTVar1;
  TestNode *pTVar2;
  
  testCtx = (tessellationTests->super_TestNode).m_testCtx;
  pTVar1 = &createLimitsTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&tessellationTests->super_TestNode,pTVar1);
  pTVar1 = &createCoordinatesTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&tessellationTests->super_TestNode,pTVar1);
  pTVar1 = &createWindingTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&tessellationTests->super_TestNode,pTVar1);
  pTVar1 = &createShaderInputOutputTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&tessellationTests->super_TestNode,pTVar1);
  pTVar1 = &createMiscDrawTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&tessellationTests->super_TestNode,pTVar1);
  pTVar1 = &createCommonEdgeTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&tessellationTests->super_TestNode,pTVar1);
  pTVar1 = &createFractionalSpacingTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&tessellationTests->super_TestNode,pTVar1);
  pTVar1 = &createPrimitiveDiscardTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&tessellationTests->super_TestNode,pTVar1);
  pTVar1 = &createInvarianceTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&tessellationTests->super_TestNode,pTVar1);
  pTVar1 = &createUserDefinedIOTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&tessellationTests->super_TestNode,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,testCtx,"geometry_interaction",
             "Tessellation and geometry shader interaction tests");
  pTVar2 = &createGeometryPassthroughTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(pTVar1,pTVar2);
  pTVar2 = &createGeometryGridRenderLimitsTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(pTVar1,pTVar2);
  pTVar2 = &createGeometryGridRenderScatterTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(pTVar1,pTVar2);
  pTVar2 = &createGeometryPointSizeTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(pTVar1,pTVar2);
  tcu::TestNode::addChild(&tessellationTests->super_TestNode,pTVar1);
  return;
}

Assistant:

void createChildren (tcu::TestCaseGroup* tessellationTests)
{
	tcu::TestContext& testCtx = tessellationTests->getTestContext();

	tessellationTests->addChild(createLimitsTests				(testCtx));
	tessellationTests->addChild(createCoordinatesTests			(testCtx));
	tessellationTests->addChild(createWindingTests				(testCtx));
	tessellationTests->addChild(createShaderInputOutputTests	(testCtx));
	tessellationTests->addChild(createMiscDrawTests				(testCtx));
	tessellationTests->addChild(createCommonEdgeTests			(testCtx));
	tessellationTests->addChild(createFractionalSpacingTests	(testCtx));
	tessellationTests->addChild(createPrimitiveDiscardTests		(testCtx));
	tessellationTests->addChild(createInvarianceTests			(testCtx));
	tessellationTests->addChild(createUserDefinedIOTests		(testCtx));
	tessellationTests->addChild(createGeometryInteractionTests	(testCtx));
}